

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerSyncHotJournal(Pager *pPager)

{
  long in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 0;
  if (*(char *)(in_RDI + 0xb) == '\0') {
    iVar1 = sqlite3OsSync((sqlite3_file *)(ulong)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec
                         );
  }
  if (iVar1 == 0) {
    iVar1 = sqlite3OsFileSize((sqlite3_file *)(ulong)in_stack_fffffffffffffff0,
                              (i64 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return iVar1;
}

Assistant:

static int pagerSyncHotJournal(Pager *pPager){
  int rc = SQLITE_OK;
  if( !pPager->noSync ){
    rc = sqlite3OsSync(pPager->jfd, SQLITE_SYNC_NORMAL);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3OsFileSize(pPager->jfd, &pPager->journalHdr);
  }
  return rc;
}